

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

result_t benchmark_sum_dividers<long,std::vector<long,std::allocator<long>>>
                   (vector<long,_std::allocator<long>_> *dividers,size_t iters)

{
  result_t rVar1;
  size_t sVar2;
  duration<double,_std::ratio<1L,_1L>_> *this;
  vector<long,_std::allocator<long>_> *in_RSI;
  rep_conflict rVar3;
  duration<double,_std::ratio<1L,_1L>_> seconds;
  time_point t2;
  long numerator;
  size_t sum;
  time_point t1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa0;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffa8;
  vector<long,_std::allocator<long>_> *dividers_00;
  long numerator_00;
  size_t local_30;
  vector<long,_std::allocator<long>_> *local_20;
  
  std::chrono::_V2::system_clock::now();
  local_30 = 0;
  for (local_20 = in_RSI; local_20 != (vector<long,_std::allocator<long>_> *)0x0;
      local_20 = (vector<long,_std::allocator<long>_> *)
                 ((long)&local_20[-1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7)) {
    numerator_00 = 2;
    dividers_00 = local_20;
    std::max<long>((long *)&stack0xffffffffffffffc0,(long *)&stack0xffffffffffffffb8);
    sVar2 = sum_dividers<long,std::vector<long,std::allocator<long>>>(numerator_00,dividers_00);
    local_30 = sVar2 + local_30;
  }
  this = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffffa8.__r,in_stack_ffffffffffffffa0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (this,(duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffa8.__r);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffa8);
  rVar1.sum = local_30;
  rVar1.duration = rVar3;
  return rVar1;
}

Assistant:

NOINLINE result_t benchmark_sum_dividers(const D& dividers, size_t iters) {
    auto t1 = std::chrono::system_clock::now();
    size_t sum = 0;

    for (; iters > 0; iters--) {
        // Unsigned branchfree divider cannot be 1
        T numerator = std::max((T)2, (T)iters);
        sum += sum_dividers(numerator, dividers);
    }

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    return result_t{seconds.count(), sum};
}